

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::MultiVertexArrayStorageTests::addStorageCases
          (MultiVertexArrayStorageTests *this,Spec *spec,int depth)

{
  Storage storage_;
  pointer pAVar1;
  GLValue max_;
  Storage *pSVar2;
  MultiVertexArrayTest *this_00;
  uint uVar3;
  ulong uVar4;
  Spec *this_01;
  long lVar5;
  GLValue GVar6;
  string desc;
  string name;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  ArraySpec *local_c8;
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  *local_c0;
  char *local_b8;
  int local_b0;
  vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
  local_a8;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  undefined1 local_70 [32];
  GLValue local_50;
  GLValue local_40;
  
  if (depth == 0) {
    pAVar1 = (spec->arrays).
             super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (ulong)((long)(spec->arrays).
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 6;
    if (0 < (int)uVar4) {
      pSVar2 = &pAVar1->storage;
      do {
        if (*pSVar2 != STORAGE_USER) {
          this_01 = spec;
          getTestName_abi_cxx11_((string *)local_70,(MultiVertexArrayStorageTests *)spec,spec);
          getTestName_abi_cxx11_((string *)local_e8,(MultiVertexArrayStorageTests *)this_01,spec);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,spec,
                     (char *)local_70._0_8_,(char *)local_e8._0_8_);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
            operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_70._0_8_ == local_70 + 0x10) {
            return;
          }
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
          return;
        }
        pSVar2 = pSVar2 + 0x10;
        uVar3 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar3;
      } while (uVar3 != 0);
    }
  }
  else {
    local_c0 = &spec->arrays;
    lVar5 = 0;
    do {
      storage_ = *(Storage *)
                  ((long)deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                         arrayUsageChoices + lVar5);
      GVar6 = deqp::gls::GLValue::getMinValue(INPUTTYPE_FLOAT);
      aStack_78 = GVar6.field_1;
      local_80 = GVar6.type;
      GVar6 = deqp::gls::GLValue::getMaxValue(INPUTTYPE_FLOAT);
      aStack_88 = GVar6.field_1;
      local_90 = GVar6.type;
      max_._4_4_ = uStack_8c;
      max_.type = local_90;
      GVar6._4_4_ = uStack_7c;
      GVar6.type = local_80;
      GVar6.field_1 = aStack_78;
      max_.field_1 = aStack_88;
      deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                ((ArraySpec *)local_70,INPUTTYPE_FLOAT,OUTPUTTYPE_VEC2,storage_,USAGE_DYNAMIC_DRAW,2
                 ,0,0,false,GVar6,max_);
      local_e8._8_4_ = spec->first;
      local_e8._0_8_ = *(undefined8 *)spec;
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::vector((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                *)(local_e8 + 0x10),local_c0);
      if ((ArraySpec *)local_d8._8_8_ == local_c8) {
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)(local_e8 + 0x10),(iterator)local_d8._8_8_,(ArraySpec *)local_70);
      }
      else {
        ((GLValue *)(local_d8._8_8_ + 0x30))->type = local_40.type;
        *(undefined4 *)&((GLValue *)(local_d8._8_8_ + 0x30))->field_0x4 = local_40._4_4_;
        *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(local_d8._8_8_ + 0x38) = local_40.field_1;
        ((GLValue *)(local_d8._8_8_ + 0x20))->type = local_50.type;
        *(undefined4 *)&((GLValue *)(local_d8._8_8_ + 0x20))->field_0x4 = local_50._4_4_;
        *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(local_d8._8_8_ + 0x28) = local_50.field_1;
        *(undefined8 *)(local_d8._8_8_ + 0x10) = local_70._16_8_;
        *(undefined8 *)(local_d8._8_8_ + 0x18) = local_70._24_8_;
        *(undefined8 *)local_d8._8_8_ = local_70._0_8_;
        *(undefined8 *)(local_d8._8_8_ + 8) = local_70._8_8_;
        local_d8._8_8_ = local_d8._8_8_ + 0x40;
      }
      local_b0 = local_e8._8_4_;
      local_b8 = (char *)local_e8._0_8_;
      std::
      vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
      ::vector(&local_a8,
               (vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                *)(local_e8 + 0x10));
      addStorageCases(this,(Spec *)&local_b8,depth + -1);
      if (local_a8.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_d8._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_d8._M_allocated_capacity,(long)local_c8 - local_d8._0_8_);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 == 4);
  }
  return;
}

Assistant:

void MultiVertexArrayStorageTests::addStorageCases (MultiVertexArrayTest::Spec spec, int depth)
{
	if (depth == 0)
	{
		// Skip trivial case, used elsewhere
		bool ok = false;
		for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
		{
			if (spec.arrays[arrayNdx].storage != Array::STORAGE_USER)
			{
				ok = true;
				break;
			}
		}

		if (!ok)
			return;

		std::string name = getTestName(spec);
		std::string desc = getTestName(spec);

		addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), desc.c_str()));
		return;
	}

	Array::Storage storages[] = {Array::STORAGE_USER, Array::STORAGE_BUFFER};
	for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
	{
		MultiVertexArrayTest::Spec::ArraySpec arraySpec(Array::INPUTTYPE_FLOAT,
														Array::OUTPUTTYPE_VEC2,
														storages[storageNdx],
														Array::USAGE_DYNAMIC_DRAW,
														2,
														0,
														0,
														false,
														GLValue::getMinValue(Array::INPUTTYPE_FLOAT),
														GLValue::getMaxValue(Array::INPUTTYPE_FLOAT));

		MultiVertexArrayTest::Spec _spec = spec;
		_spec.arrays.push_back(arraySpec);
		addStorageCases(_spec, depth-1);
	}
}